

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O1

RenderSampleAnalyzeResult
deqp::gles3::Performance::anon_unknown_1::
analyzeSampleResults<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
          (TestLog *log,
          vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
          *samples)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  pointer pRVar3;
  pointer pfVar4;
  undefined8 uVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *log_00;
  undefined8 uVar6;
  deUint64 *pdVar7;
  int *piVar8;
  pointer pRVar9;
  SampleBuilder *pSVar10;
  uint uVar11;
  ulong target;
  long lVar12;
  int endNdx;
  long lVar13;
  size_type __n;
  ulong uVar14;
  uint uVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  RenderSampleAnalyzeResult RVar21;
  vector<float,_std::allocator<float>_> processingRates;
  vector<unsigned_long,_std::allocator<unsigned_long>_> values;
  size_type __dnew;
  LineParametersWithConfidence contributionFitting;
  ScopedLogSection section_1;
  LineParametersWithConfidence theilSenFitting;
  size_type __dnew_3;
  size_type __dnew_4;
  ScopedLogSection section;
  ScopedLogSection section_2;
  StatsType resultStats;
  undefined1 local_ac0 [12];
  float fStack_ab4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_ab0;
  string local_aa0;
  string local_a80;
  qpSampleValueTag local_a60;
  float local_a5c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a58;
  undefined1 local_a50 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_a40;
  string local_a30;
  string local_a10;
  qpSampleValueTag local_9f0;
  float local_9ec;
  undefined1 local_9e8 [16];
  LogNumber<float> local_9d0;
  undefined1 local_968 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_958;
  string local_948;
  LogNumber<float> local_928;
  LogNumber<float> local_8c0;
  LineParametersWithConfidence local_854;
  string local_838;
  string local_818;
  string local_7f8;
  string local_7d8;
  string local_7b8;
  string local_798;
  string local_778;
  string local_758;
  string local_738;
  string local_718;
  LogNumber<float> local_6f8;
  LogNumber<float> local_690;
  string local_628;
  string local_608;
  string local_5e8;
  float local_5c4;
  float local_5c0;
  float local_5bc;
  float local_5b8;
  float local_5b4;
  float local_5b0;
  float local_5ac;
  float local_5a8;
  float local_5a4;
  float local_5a0;
  float local_59c;
  LogNumber<float> local_598;
  LogNumber<float> local_530;
  LogNumber<float> local_4c8;
  LogNumber<float> local_460;
  LogNumber<float> local_3f8;
  string local_390;
  ScopedLogSection local_370;
  string local_368;
  string local_348;
  string local_328;
  string local_308;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  SingleOperationStatistics local_e4;
  SingleOperationStatistics local_d0;
  float local_bc;
  float local_b8;
  float local_b4;
  float local_b0;
  float local_ac;
  SingleOperationStatistics local_a8;
  float local_94;
  undefined4 uStack_90;
  float fStack_8c;
  float fStack_88;
  undefined4 local_84;
  float local_80;
  float local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            (&local_854,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_a50,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)local_ac0);
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  __n = ((long)(samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) * 0x6db6db6db6db6db7
  ;
  uVar11 = (uint)__n;
  if (0 < (int)uVar11) {
    pdVar7 = &(pRVar9->duration).fitResponseDuration;
    uVar14 = 0;
    do {
      *(deUint64 *)(local_a50._0_8_ + uVar14 * 8) = *pdVar7;
      uVar14 = uVar14 + 1;
      pdVar7 = pdVar7 + 7;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,__n,(allocator_type *)&local_9d0);
  uVar5 = local_ac0._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      *(float *)(local_ac0._0_8_ + uVar14 * 4) =
           (float)*piVar8 / (((float)*(ulong *)(local_a50._0_8_ + uVar14 * 8) / 1000.0) / 1000.0);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac0._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ac0._0_8_;
  fVar16 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1) * 0.5;
  fVar17 = floorf(fVar16);
  fVar16 = fVar16 - (float)(int)fVar17;
  local_94 = (1.0 - fVar16) * *(float *)(uVar5 + (long)(int)fVar17 * 4) +
             fVar16 * *(float *)(uVar5 + (long)((int)fVar17 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ab0._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_9d0);
  uVar5 = local_ac0._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      *(float *)(local_ac0._0_8_ + uVar14 * 4) =
           (float)*(ulong *)(local_a50._0_8_ + uVar14 * 8) -
           ((float)*piVar8 * local_854.coefficient + local_854.offset);
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac0._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  uVar5 = local_ac0._0_8_;
  uStack_90 = *(undefined4 *)(CONCAT44(fStack_ab4,local_ac0._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1);
  local_9e8._0_4_ = fVar17 * 0.9;
  fVar16 = floorf((float)local_9e8._0_4_);
  fStack_8c = (1.0 - ((float)local_9e8._0_4_ - (float)(int)fVar16)) *
              *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              ((float)local_9e8._0_4_ - (float)(int)fVar16) *
              *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  fStack_88 = (1.0 - fVar17) * *(float *)(uVar5 + (long)(int)fVar16 * 4) +
              fVar17 * *(float *)(uVar5 + (long)((int)fVar16 + 1) * 4);
  if ((pointer)uVar5 != (pointer)0x0) {
    operator_delete((void *)uVar5,local_ab0._M_allocated_capacity - uVar5);
  }
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_ac0,
             ((long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(samples->
                    super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7,
             (allocator_type *)&local_9d0);
  uVar5 = local_ac0._0_8_;
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (int)((long)(samples->
                       super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9 >> 3) *
           -0x49249249;
  if (0 < (int)uVar11) {
    piVar8 = &pRVar9->renderDataSize;
    uVar14 = 0;
    do {
      fVar16 = (float)*piVar8 * local_854.coefficient + local_854.offset;
      fVar17 = 0.0;
      if (1.0 <= fVar16) {
        fVar17 = ((float)*(ulong *)(local_a50._0_8_ + uVar14 * 8) - fVar16) / fVar16;
      }
      *(float *)(local_ac0._0_8_ + uVar14 * 4) = fVar17;
      uVar14 = uVar14 + 1;
      piVar8 = piVar8 + 0xe;
    } while ((uVar11 & 0x7fffffff) != uVar14);
  }
  pfVar4 = (pointer)CONCAT44(fStack_ab4,local_ac0._8_4_);
  if ((pointer)local_ac0._0_8_ != pfVar4) {
    uVar14 = (long)pfVar4 - local_ac0._0_8_ >> 2;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_ac0._0_8_,pfVar4,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<float*,std::vector<float,std::allocator<float>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,pfVar4);
  }
  local_84 = *(undefined4 *)(CONCAT44(fStack_ab4,local_ac0._8_4_) + -4);
  fVar17 = (float)((CONCAT44(fStack_ab4,local_ac0._8_4_) - local_ac0._0_8_ >> 2) - 1);
  fVar16 = fVar17 * 0.9;
  local_9e8._0_4_ = fVar16;
  fVar16 = floorf(fVar16);
  local_80 = (1.0 - ((float)local_9e8._0_4_ - (float)(int)fVar16)) *
             *(float *)(local_ac0._0_8_ + (long)(int)fVar16 * 4) +
             ((float)local_9e8._0_4_ - (float)(int)fVar16) *
             *(float *)(local_ac0._0_8_ + (long)((int)fVar16 + 1) * 4);
  fVar17 = fVar17 * 0.5;
  fVar16 = floorf(fVar17);
  fVar17 = fVar17 - (float)(int)fVar16;
  local_7c = (1.0 - fVar17) * *(float *)(local_ac0._0_8_ + (long)(int)fVar16 * 4) +
             fVar17 * *(float *)(local_ac0._0_8_ + (long)((int)fVar16 + 1) * 4);
  if ((pointer)local_ac0._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity - local_ac0._0_8_);
  }
  uVar6 = local_a50._8_8_;
  uVar5 = local_a50._0_8_;
  if (local_a50._0_8_ != local_a50._8_8_) {
    uVar14 = (long)(local_a50._8_8_ - local_a50._0_8_) >> 3;
    lVar12 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar12 == 0; lVar12 = lVar12 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_a50._0_8_,local_a50._8_8_,((uint)lVar12 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_less_iter>
              (uVar5,uVar6);
  }
  local_bc = (float)*(ulong *)local_a50._0_8_;
  local_b8 = (float)(ulong)(((pointer)(local_a50._8_8_ + -0x10))->value).int64;
  fVar17 = (float)(((long)(local_a50._8_8_ - local_a50._0_8_) >> 3) - 1);
  local_9e8._0_4_ = fVar17 * 0.5;
  fVar16 = floorf(fVar17 * 0.5);
  local_b4 = (float)*(ulong *)(local_a50._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9e8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a50._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9e8._0_4_ - (float)(int)fVar16));
  local_9e8._0_4_ = fVar17 * 0.1;
  fVar16 = floorf(fVar17 * 0.1);
  local_b0 = (float)*(ulong *)(local_a50._0_8_ + (long)((int)fVar16 + 1) * 8) *
             ((float)local_9e8._0_4_ - (float)(int)fVar16) +
             (float)*(ulong *)(local_a50._0_8_ + (long)(int)fVar16 * 8) *
             (1.0 - ((float)local_9e8._0_4_ - (float)(int)fVar16));
  fVar16 = floorf(fVar17 * 0.9);
  uVar14 = *(ulong *)(local_a50._0_8_ + (long)(int)fVar16 * 8);
  target = uVar14;
  if ((long)uVar14 < 0) {
    target = (ulong)((uint)uVar14 & 1) | uVar14 >> 1;
  }
  fVar17 = fVar17 * 0.9 - (float)(int)fVar16;
  uVar2 = *(ulong *)(local_a50._0_8_ + (long)((int)fVar16 + 1) * 8);
  if ((long)uVar2 < 0) {
    target = uVar2 >> 1;
  }
  local_ac = (float)uVar2 * fVar17 + (float)uVar14 * (1.0 - fVar17);
  operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity - local_a50._0_8_);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&local_e4,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x0,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&local_d0,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x8,target);
  Performance::(anonymous_namespace)::
  calculateSingleOperationStatistics<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>>
            (&local_a8,(_anonymous_namespace_ *)samples,
             (vector<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
              *)0x18,target);
  local_a50._0_8_ = &aStack_a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"Samples","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Samples","");
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_390,log,(string *)local_a50,(string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  local_3f8.m_name._M_dataplus._M_p = (pointer)&local_3f8.m_name.field_2;
  local_3f8.m_name._M_string_length = 7;
  local_3f8.m_name.field_2._M_allocated_capacity = 0x73656c706d6153;
  local_460.m_name._M_dataplus._M_p = (pointer)&local_460.m_name.field_2;
  local_460.m_name.field_2._M_allocated_capacity._0_4_ = 0x706d6153;
  local_460.m_name._M_string_length = 7;
  local_460.m_name.field_2._M_allocated_capacity._4_4_ = 0x73656c;
  tcu::LogSampleList::LogSampleList((LogSampleList *)&local_928,&local_3f8.m_name,&local_460.m_name)
  ;
  tcu::TestLog::startSampleList(log,&local_928.m_name,&local_928.m_desc);
  tcu::TestLog::startSampleInfo(log);
  local_8c0.m_name._M_dataplus._M_p = (pointer)&local_8c0.m_name.field_2;
  local_8c0.m_name.field_2._M_allocated_capacity._0_6_ = 0x695361746144;
  local_8c0.m_name.field_2._M_local_buf[6] = 'z';
  local_8c0.m_name.field_2._M_local_buf[7] = 'e';
  local_8c0.m_name._M_string_length = 8;
  local_8c0.m_name.field_2._M_local_buf[8] = '\0';
  local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
  local_530.m_name.field_2._M_allocated_capacity._0_6_ = 0x702061746144;
  local_530.m_name.field_2._M_allocated_capacity._6_2_ = 0x6f72;
  local_530.m_name.field_2._8_6_ = 0x646573736563;
  local_530.m_name._M_string_length = 0xe;
  local_530.m_name.field_2._M_local_buf[0xe] = '\0';
  local_4c8.m_name._M_dataplus._M_p = (pointer)&local_4c8.m_name.field_2;
  local_4c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7962;
  local_4c8.m_name.field_2._M_local_buf[2] = 't';
  local_4c8.m_name.field_2._M_local_buf[3] = 'e';
  local_4c8.m_name.field_2._M_allocated_capacity._4_2_ = 0x73;
  local_4c8.m_name._M_string_length = 5;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_a50,&local_8c0.m_name,&local_530.m_name,&local_4c8.m_name,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  tcu::TestLog::writeValueInfo(log,(string *)local_a50,&local_a30,&local_a10,local_9f0);
  local_968._0_8_ = &local_958;
  local_958._M_allocated_capacity._0_7_ = 0x43786574726556;
  local_958._7_4_ = 0x746e756f;
  local_968._8_8_ = 0xb;
  local_958._M_local_buf[0xb] = '\0';
  local_9d0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  local_948._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_948,(ulong)&local_9d0);
  local_948.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
  *(undefined8 *)local_948._M_dataplus._M_p = 0x6f207265626d754e;
  *(undefined8 *)((long)local_948._M_dataplus._M_p + 8) = 0x6369747265762066;
  *(undefined2 *)((long)local_948._M_dataplus._M_p + 0x10) = 0x7365;
  local_948._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
  local_9d0.m_name._M_dataplus._M_p[(long)local_948._M_dataplus._M_p] = '\0';
  local_5e8.field_2._M_allocated_capacity = 0x7365636974726576;
  local_5e8._M_string_length = 8;
  local_5e8.field_2._M_local_buf[8] = '\0';
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)local_ac0,(string *)local_968,&local_948,&local_5e8,
             QP_SAMPLE_VALUE_TAG_PREDICTOR);
  local_a58 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)log;
  tcu::TestLog::writeValueInfo(log,(string *)local_ac0,&local_aa0,&local_a80,local_a60);
  local_608.field_2._M_allocated_capacity = 0x6d69546c61746f54;
  local_608.field_2._8_2_ = 0x65;
  local_608._M_string_length = 9;
  local_628.field_2._M_allocated_capacity = 0x6974206c61746f54;
  local_628.field_2._8_2_ = 0x656d;
  local_628._M_string_length = 10;
  local_628.field_2._M_local_buf[10] = '\0';
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  local_718.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_718._M_string_length = 2;
  local_718.field_2._M_local_buf[2] = '\0';
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_9d0,&local_608,&local_628,&local_718,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a58->_M_allocated_capacity,&local_9d0.m_name,&local_9d0.m_desc,
             &local_9d0.m_unit,local_9d0.m_tag);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  local_738.field_2._M_allocated_capacity = 0x6c6c614377617244;
  local_738.field_2._8_4_ = 0x656d6954;
  local_738._M_string_length = 0xc;
  local_738.field_2._M_local_buf[0xc] = '\0';
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  local_758.field_2._M_allocated_capacity._0_6_ = 0x632077617244;
  local_758.field_2._M_allocated_capacity._6_2_ = 0x6c61;
  local_758.field_2._8_6_ = 0x656d6974206c;
  local_758._M_string_length = 0xe;
  local_758.field_2._M_local_buf[0xe] = '\0';
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  local_778.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_778._M_string_length = 2;
  local_778.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_690,&local_738,&local_758,&local_778,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a58->_M_allocated_capacity,&local_690.m_name,&local_690.m_desc,
             &local_690.m_unit,local_690.m_tag);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  local_798.field_2._M_allocated_capacity = 0x656d695464616552;
  local_798._M_string_length = 8;
  local_798.field_2._M_local_buf[8] = '\0';
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  local_7b8.field_2._M_allocated_capacity._0_7_ = 0x78695064616552;
  local_7b8.field_2._M_local_buf[7] = 'e';
  local_7b8.field_2._8_7_ = 0x656d697420736c;
  local_7b8._M_string_length = 0xf;
  local_7b8.field_2._M_local_buf[0xf] = '\0';
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  local_7d8.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_7d8._M_string_length = 2;
  local_7d8.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_6f8,&local_798,&local_7b8,&local_7d8,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a58->_M_allocated_capacity,&local_6f8.m_name,&local_6f8.m_desc,
             &local_6f8.m_unit,local_6f8.m_tag);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  local_7f8.field_2._M_allocated_capacity._0_7_ = 0x69736552746946;
  local_7f8.field_2._7_4_ = 0x6c617564;
  local_7f8._M_string_length = 0xb;
  local_7f8.field_2._M_local_buf[0xb] = '\0';
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  local_818.field_2._M_allocated_capacity = 0x6973657220746946;
  local_818.field_2._8_4_ = 0x6c617564;
  local_818._M_string_length = 0xc;
  local_818.field_2._M_local_buf[0xc] = '\0';
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  local_838.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_838._M_string_length = 2;
  local_838.field_2._M_local_buf[2] = '\0';
  tcu::LogValueInfo::LogValueInfo
            ((LogValueInfo *)&local_598,&local_7f8,&local_818,&local_838,
             QP_SAMPLE_VALUE_TAG_RESPONSE);
  paVar1 = local_a58;
  tcu::TestLog::writeValueInfo
            ((TestLog *)&local_a58->_M_allocated_capacity,&local_598.m_name,&local_598.m_desc,
             &local_598.m_unit,local_598.m_tag);
  tcu::TestLog::endSampleInfo((TestLog *)&paVar1->_M_allocated_capacity);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_unit._M_dataplus._M_p != &local_598.m_unit.field_2) {
    operator_delete(local_598.m_unit._M_dataplus._M_p,
                    local_598.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_desc._M_dataplus._M_p != &local_598.m_desc.field_2) {
    operator_delete(local_598.m_desc._M_dataplus._M_p,
                    local_598.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_name._M_dataplus._M_p != &local_598.m_name.field_2) {
    operator_delete(local_598.m_name._M_dataplus._M_p,
                    CONCAT53(local_598.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_598.m_name.field_2._M_local_buf[2],
                                      local_598.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,
                    CONCAT53(local_838.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_838.field_2._M_local_buf[2],
                                      local_838.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,
                    CONCAT17(local_7f8.field_2._M_local_buf[7],
                             local_7f8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_unit._M_dataplus._M_p != &local_6f8.m_unit.field_2) {
    operator_delete(local_6f8.m_unit._M_dataplus._M_p,
                    local_6f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_desc._M_dataplus._M_p != &local_6f8.m_desc.field_2) {
    operator_delete(local_6f8.m_desc._M_dataplus._M_p,
                    local_6f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_name._M_dataplus._M_p != &local_6f8.m_name.field_2) {
    operator_delete(local_6f8.m_name._M_dataplus._M_p,
                    local_6f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,
                    CONCAT53(local_7d8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7d8.field_2._M_local_buf[2],
                                      local_7d8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,
                    CONCAT17(local_7b8.field_2._M_local_buf[7],
                             local_7b8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_unit._M_dataplus._M_p != &local_690.m_unit.field_2) {
    operator_delete(local_690.m_unit._M_dataplus._M_p,
                    local_690.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_desc._M_dataplus._M_p != &local_690.m_desc.field_2) {
    operator_delete(local_690.m_desc._M_dataplus._M_p,
                    local_690.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    local_690.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,
                    CONCAT53(local_778.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_778.field_2._M_local_buf[2],
                                      local_778.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,
                    CONCAT26(local_758.field_2._M_allocated_capacity._6_2_,
                             local_758.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,
                    CONCAT53(local_718.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_718.field_2._M_local_buf[2],
                                      local_718.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,(ulong)(local_948.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._0_8_ != &local_958) {
    operator_delete((void *)local_968._0_8_,
                    CONCAT17(local_958._M_local_buf[7],local_958._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4c8.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_4c8.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_4c8.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_4c8.m_name.field_2._M_local_buf[2],
                                                        local_4c8.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p,
                    CONCAT26(local_530.m_name.field_2._M_allocated_capacity._6_2_,
                             local_530.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_name._M_dataplus._M_p != &local_8c0.m_name.field_2) {
    operator_delete(local_8c0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8c0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8c0.m_name.field_2._M_local_buf[6],
                                      local_8c0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_desc._M_dataplus._M_p != &local_928.m_desc.field_2) {
    operator_delete(local_928.m_desc._M_dataplus._M_p,
                    local_928.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    CONCAT17(local_928.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_928.m_name.field_2._M_local_buf[6],
                                      local_928.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_name._M_dataplus._M_p != &local_460.m_name.field_2) {
    operator_delete(local_460.m_name._M_dataplus._M_p,
                    CONCAT44(local_460.m_name.field_2._M_allocated_capacity._4_4_,
                             local_460.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
    operator_delete(local_3f8.m_name._M_dataplus._M_p,
                    local_3f8.m_name.field_2._M_allocated_capacity + 1);
  }
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(samples->
                              super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9) >> 3) *
          -0x49249249) {
    lVar13 = 0;
    lVar12 = 0;
    do {
      uVar14 = *(ulong *)((long)&(pRVar9->duration).fitResponseDuration + lVar13);
      local_9e8._0_4_ =
           (float)*(int *)((long)&pRVar9->renderDataSize + lVar13) * local_854.coefficient +
           local_854.offset;
      local_a50._0_8_ = local_a58;
      local_a50._8_8_ = (pointer)0x0;
      aStack_a40._M_allocated_capacity = 0;
      aStack_a40._8_8_ = 0;
      pSVar10 = tcu::SampleBuilder::operator<<
                          ((SampleBuilder *)local_a50,
                           *(int *)((long)&pRVar9->renderDataSize + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&((samples->
                                                                                                        
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  numVertices + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).renderReadDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).renderDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<
                          (pSVar10,*(int *)((long)&(((samples->
                                                                                                          
                                                  super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->
                                                  duration).readDuration + lVar13));
      pSVar10 = tcu::SampleBuilder::operator<<(pSVar10,(float)uVar14 - (float)local_9e8._0_4_);
      tcu::SampleBuilder::operator<<(pSVar10,(EndSampleToken *)&tcu::TestLog::EndSample);
      if ((pointer)local_a50._8_8_ != (pointer)0x0) {
        operator_delete((void *)local_a50._8_8_,aStack_a40._8_8_ - local_a50._8_8_);
      }
      lVar12 = lVar12 + 1;
      pRVar9 = (samples->
               super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      lVar13 = lVar13 + 0x38;
    } while (lVar12 < (int)((ulong)((long)(samples->
                                          super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                          )._M_impl.super__Vector_impl_data._M_finish - (long)pRVar9
                                   ) >> 3) * -0x49249249);
  }
  log_00 = local_a58;
  tcu::TestLog::endSampleList((TestLog *)&local_a58->_M_allocated_capacity);
  tcu::TestLog::endSection((TestLog *)local_390._M_dataplus._M_p);
  local_a50._0_8_ = &aStack_a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"Contribution","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Contributions","");
  paVar1 = &local_3f8.m_name.field_2;
  tcu::ScopedLogSection::ScopedLogSection
            ((ScopedLogSection *)&local_948,(TestLog *)&log_00->_M_allocated_capacity,
             (string *)local_a50,(string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_968,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,0)
  ;
  local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"DrawCallConstantCost","");
  local_6f8.m_name._M_dataplus._M_p = (pointer)&local_6f8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"DrawCall: Approximated contant cost","");
  local_598.m_name._M_dataplus._M_p = (pointer)&local_598.m_name.field_2;
  local_598.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_598.m_name._M_string_length = 2;
  local_598.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a50,&local_690.m_name,&local_6f8.m_name,&local_598.m_name,
             QP_KEY_TAG_TIME,(float)local_968._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a50._0_8_,
             local_a30._M_dataplus._M_p,local_a10._M_dataplus._M_p,local_9f0,local_9ec);
  local_928.m_name._M_dataplus._M_p = (pointer)&local_928.m_name.field_2;
  local_9d0.m_name._M_dataplus._M_p = (pointer)0x12;
  local_928.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_928,(ulong)&local_9d0);
  local_928.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_9d0.m_name._M_dataplus._M_p,0);
  local_928.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_9d0.m_name._M_dataplus._M_p >> 0x30);
  local_928.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_9d0.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_928.m_name._M_dataplus._M_p,"DrawCallLinearCost",0x12);
  local_928.m_name._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
  local_928.m_name._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
  local_9d0.m_name._M_dataplus._M_p = (char *)0x22;
  local_3f8.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_3f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_9d0);
  local_3f8.m_name.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_3f8.m_name._M_dataplus._M_p,"DrawCall: Approximated linear cost",0x22);
  local_3f8.m_name._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
  local_3f8.m_name._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
  local_460.m_name._M_dataplus._M_p = (pointer)&local_460.m_name.field_2;
  local_460.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_460.m_name._M_string_length = 7;
  local_460.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_928.m_name,&local_3f8.m_name,&local_460.m_name,
             QP_KEY_TAG_TIME,(float)local_968._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ac0._0_8_,
             local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,local_a60,local_a5c);
  local_8c0.m_name._M_dataplus._M_p = (pointer)&local_8c0.m_name.field_2;
  local_530.m_name._M_dataplus._M_p = (pointer)0x12;
  local_8c0.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_8c0,(ulong)&local_530);
  local_8c0.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_530.m_name._M_dataplus._M_p,0);
  local_8c0.m_name.field_2._M_local_buf[6] =
       (char)((ulong)local_530.m_name._M_dataplus._M_p >> 0x30);
  local_8c0.m_name.field_2._M_local_buf[7] =
       (char)((ulong)local_530.m_name._M_dataplus._M_p >> 0x38);
  builtin_strncpy(local_8c0.m_name._M_dataplus._M_p,"DrawCallMedianCost",0x12);
  local_8c0.m_name._M_string_length = (size_type)local_530.m_name._M_dataplus._M_p;
  local_8c0.m_name._M_dataplus._M_p[(long)local_530.m_name._M_dataplus._M_p] = '\0';
  local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
  local_4c8.m_name._M_dataplus._M_p = (pointer)0x15;
  local_530.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_4c8);
  local_530.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_4c8.m_name._M_dataplus._M_p,0);
  local_530.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_4c8.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_530.m_name._M_dataplus._M_p,"DrawCall: Median cost",0x15);
  local_530.m_name._M_string_length = (size_type)local_4c8.m_name._M_dataplus._M_p;
  local_530.m_name._M_dataplus._M_p[(long)local_4c8.m_name._M_dataplus._M_p] = '\0';
  local_4c8.m_name._M_dataplus._M_p = (pointer)&local_4c8.m_name.field_2;
  local_4c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4c8.m_name._M_string_length = 2;
  local_4c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9d0,&local_8c0.m_name,&local_530.m_name,&local_4c8.m_name,QP_KEY_TAG_TIME,
             local_e4.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_9d0.m_name._M_dataplus._M_p,
             local_9d0.m_desc._M_dataplus._M_p,local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,
             local_9d0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4c8.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_4c8.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_4c8.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_4c8.m_name.field_2._M_local_buf[2],
                                                        local_4c8.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p,
                    CONCAT26(local_530.m_name.field_2._M_allocated_capacity._6_2_,
                             local_530.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_name._M_dataplus._M_p != &local_8c0.m_name.field_2) {
    operator_delete(local_8c0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8c0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8c0.m_name.field_2._M_local_buf[6],
                                      local_8c0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_name._M_dataplus._M_p != &local_460.m_name.field_2) {
    operator_delete(local_460.m_name._M_dataplus._M_p,
                    CONCAT44(local_460.m_name.field_2._M_allocated_capacity._4_4_,
                             local_460.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_name._M_dataplus._M_p,
                    (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    CONCAT17(local_928.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_928.m_name.field_2._M_local_buf[6],
                                      local_928.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_name._M_dataplus._M_p != &local_598.m_name.field_2) {
    operator_delete(local_598.m_name._M_dataplus._M_p,
                    CONCAT53(local_598.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_598.m_name.field_2._M_local_buf[2],
                                      local_598.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_name._M_dataplus._M_p != &local_6f8.m_name.field_2) {
    operator_delete(local_6f8.m_name._M_dataplus._M_p,
                    local_6f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    local_690.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_968,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,8)
  ;
  local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"ReadConstantCost","");
  local_6f8.m_name._M_dataplus._M_p = (pointer)&local_6f8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"Read: Approximated contant cost","");
  local_598.m_name._M_dataplus._M_p = (pointer)&local_598.m_name.field_2;
  local_598.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_598.m_name._M_string_length = 2;
  local_598.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a50,&local_690.m_name,&local_6f8.m_name,&local_598.m_name,
             QP_KEY_TAG_TIME,(float)local_968._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a50._0_8_,
             local_a30._M_dataplus._M_p,local_a10._M_dataplus._M_p,local_9f0,local_9ec);
  local_928.m_name._M_dataplus._M_p = (pointer)&local_928.m_name.field_2;
  local_928.m_name.field_2._M_allocated_capacity._0_6_ = 0x694c64616552;
  local_928.m_name.field_2._M_local_buf[6] = 'n';
  local_928.m_name.field_2._M_local_buf[7] = 'e';
  local_928.m_name.field_2._8_6_ = 0x74736f437261;
  local_928.m_name._M_string_length = 0xe;
  local_928.m_name.field_2._M_local_buf[0xe] = '\0';
  local_9d0.m_name._M_dataplus._M_p = (char *)0x1e;
  local_3f8.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_3f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_9d0);
  local_3f8.m_name.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_3f8.m_name._M_dataplus._M_p,"Read: Approximated linear cost",0x1e);
  local_3f8.m_name._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
  local_3f8.m_name._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
  local_460.m_name._M_dataplus._M_p = (pointer)&local_460.m_name.field_2;
  local_460.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_460.m_name._M_string_length = 7;
  local_460.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_928.m_name,&local_3f8.m_name,&local_460.m_name,
             QP_KEY_TAG_TIME,(float)local_968._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ac0._0_8_,
             local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,local_a60,local_a5c);
  local_8c0.m_name._M_dataplus._M_p = (pointer)&local_8c0.m_name.field_2;
  local_8c0.m_name.field_2._M_allocated_capacity._0_6_ = 0x654d64616552;
  local_8c0.m_name.field_2._M_local_buf[6] = 'd';
  local_8c0.m_name.field_2._M_local_buf[7] = 'i';
  local_8c0.m_name.field_2._M_local_buf[8] = 'a';
  local_8c0.m_name.field_2._9_5_ = 0x74736f436e;
  local_8c0.m_name._M_string_length = 0xe;
  local_8c0.m_name.field_2._M_local_buf[0xe] = '\0';
  local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
  local_4c8.m_name._M_dataplus._M_p = (pointer)0x11;
  local_530.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_4c8);
  local_530.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_4c8.m_name._M_dataplus._M_p,0);
  local_530.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_4c8.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_530.m_name._M_dataplus._M_p,"Read: Median cost",0x11);
  local_530.m_name._M_string_length = (size_type)local_4c8.m_name._M_dataplus._M_p;
  local_530.m_name._M_dataplus._M_p[(long)local_4c8.m_name._M_dataplus._M_p] = '\0';
  local_4c8.m_name._M_dataplus._M_p = (pointer)&local_4c8.m_name.field_2;
  local_4c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4c8.m_name._M_string_length = 2;
  local_4c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9d0,&local_8c0.m_name,&local_530.m_name,&local_4c8.m_name,QP_KEY_TAG_TIME,
             local_d0.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_9d0.m_name._M_dataplus._M_p,
             local_9d0.m_desc._M_dataplus._M_p,local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,
             local_9d0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4c8.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_4c8.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_4c8.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_4c8.m_name.field_2._M_local_buf[2],
                                                        local_4c8.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p,
                    CONCAT26(local_530.m_name.field_2._M_allocated_capacity._6_2_,
                             local_530.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_name._M_dataplus._M_p != &local_8c0.m_name.field_2) {
    operator_delete(local_8c0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8c0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8c0.m_name.field_2._M_local_buf[6],
                                      local_8c0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_name._M_dataplus._M_p != &local_460.m_name.field_2) {
    operator_delete(local_460.m_name._M_dataplus._M_p,
                    CONCAT44(local_460.m_name.field_2._M_allocated_capacity._4_4_,
                             local_460.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_name._M_dataplus._M_p,
                    (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    CONCAT17(local_928.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_928.m_name.field_2._M_local_buf[6],
                                      local_928.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_name._M_dataplus._M_p != &local_598.m_name.field_2) {
    operator_delete(local_598.m_name._M_dataplus._M_p,
                    CONCAT53(local_598.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_598.m_name.field_2._M_local_buf[2],
                                      local_598.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_name._M_dataplus._M_p != &local_6f8.m_name.field_2) {
    operator_delete(local_6f8.m_name._M_dataplus._M_p,
                    local_6f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    local_690.m_name.field_2._M_allocated_capacity + 1);
  }
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_968,samples,0,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x18);
  local_690.m_name._M_dataplus._M_p = (pointer)&local_690.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_690,"TotalConstantCost","");
  local_6f8.m_name._M_dataplus._M_p = (pointer)&local_6f8.m_name.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_6f8,"Total: Approximated contant cost","");
  local_598.m_name._M_dataplus._M_p = (pointer)&local_598.m_name.field_2;
  local_598.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_598.m_name._M_string_length = 2;
  local_598.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a50,&local_690.m_name,&local_6f8.m_name,&local_598.m_name,
             QP_KEY_TAG_TIME,(float)local_968._0_4_);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_a50._0_8_,
             local_a30._M_dataplus._M_p,local_a10._M_dataplus._M_p,local_9f0,local_9ec);
  local_928.m_name._M_dataplus._M_p = (pointer)&local_928.m_name.field_2;
  local_928.m_name.field_2._M_allocated_capacity._0_6_ = 0x4c6c61746f54;
  local_928.m_name.field_2._M_local_buf[6] = 'i';
  local_928.m_name.field_2._M_local_buf[7] = 'n';
  local_928.m_name.field_2._8_6_ = 0x736f43726165;
  local_928.m_name.field_2._M_local_buf[0xe] = 't';
  local_928.m_name._M_string_length = 0xf;
  local_928.m_name.field_2._M_local_buf[0xf] = '\0';
  local_9d0.m_name._M_dataplus._M_p = (char *)0x1f;
  local_3f8.m_name._M_dataplus._M_p = (pointer)paVar1;
  local_3f8.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_3f8,(ulong)&local_9d0);
  local_3f8.m_name.field_2._M_allocated_capacity = (size_type)local_9d0.m_name._M_dataplus._M_p;
  builtin_strncpy(local_3f8.m_name._M_dataplus._M_p,"Total: Approximated linear cost",0x1f);
  local_3f8.m_name._M_string_length = (size_type)local_9d0.m_name._M_dataplus._M_p;
  local_3f8.m_name._M_dataplus._M_p[(long)local_9d0.m_name._M_dataplus._M_p] = '\0';
  local_460.m_name._M_dataplus._M_p = (pointer)&local_460.m_name.field_2;
  local_460.m_name.field_2._M_allocated_capacity._0_4_ = 0x2f207375;
  local_460.m_name._M_string_length = 7;
  local_460.m_name.field_2._M_allocated_capacity._4_4_ = 0x424d20;
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_928.m_name,&local_3f8.m_name,&local_460.m_name,
             QP_KEY_TAG_TIME,(float)local_968._12_4_ * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,(char *)local_ac0._0_8_,
             local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,local_a60,local_a5c);
  local_8c0.m_name._M_dataplus._M_p = (pointer)&local_8c0.m_name.field_2;
  local_8c0.m_name.field_2._M_allocated_capacity._0_6_ = 0x4d6c61746f54;
  local_8c0.m_name.field_2._M_local_buf[6] = 'e';
  local_8c0.m_name.field_2._M_local_buf[7] = 'd';
  local_8c0.m_name.field_2._M_local_buf[8] = 'i';
  local_8c0.m_name.field_2._9_5_ = 0x736f436e61;
  local_8c0.m_name.field_2._M_local_buf[0xe] = 't';
  local_8c0.m_name._M_string_length = 0xf;
  local_8c0.m_name.field_2._M_local_buf[0xf] = '\0';
  local_530.m_name._M_dataplus._M_p = (pointer)&local_530.m_name.field_2;
  local_4c8.m_name._M_dataplus._M_p = (pointer)0x12;
  local_530.m_name._M_dataplus._M_p =
       (pointer)std::__cxx11::string::_M_create((ulong *)&local_530,(ulong)&local_4c8);
  local_530.m_name.field_2._M_allocated_capacity._0_6_ = SUB86(local_4c8.m_name._M_dataplus._M_p,0);
  local_530.m_name.field_2._M_allocated_capacity._6_2_ =
       (undefined2)((ulong)local_4c8.m_name._M_dataplus._M_p >> 0x30);
  builtin_strncpy(local_530.m_name._M_dataplus._M_p,"Total: Median cost",0x12);
  local_530.m_name._M_string_length = (size_type)local_4c8.m_name._M_dataplus._M_p;
  local_530.m_name._M_dataplus._M_p[(long)local_4c8.m_name._M_dataplus._M_p] = '\0';
  local_4c8.m_name._M_dataplus._M_p = (pointer)&local_4c8.m_name.field_2;
  local_4c8.m_name.field_2._M_allocated_capacity._0_2_ = 0x7375;
  local_4c8.m_name._M_string_length = 2;
  local_4c8.m_name.field_2._M_local_buf[2] = '\0';
  tcu::LogNumber<float>::LogNumber
            (&local_9d0,&local_8c0.m_name,&local_530.m_name,&local_4c8.m_name,QP_KEY_TAG_TIME,
             local_a8.medianTime);
  tcu::TestLog::writeFloat
            ((TestLog *)&log_00->_M_allocated_capacity,local_9d0.m_name._M_dataplus._M_p,
             local_9d0.m_desc._M_dataplus._M_p,local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,
             local_9d0.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4c8.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_4c8.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_4c8.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_4c8.m_name.field_2._M_local_buf[2],
                                                        local_4c8.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p,
                    CONCAT26(local_530.m_name.field_2._M_allocated_capacity._6_2_,
                             local_530.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_name._M_dataplus._M_p != &local_8c0.m_name.field_2) {
    operator_delete(local_8c0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8c0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8c0.m_name.field_2._M_local_buf[6],
                                      local_8c0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_name._M_dataplus._M_p != &local_460.m_name.field_2) {
    operator_delete(local_460.m_name._M_dataplus._M_p,
                    CONCAT44(local_460.m_name.field_2._M_allocated_capacity._4_4_,
                             local_460.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_name._M_dataplus._M_p != paVar1) {
    operator_delete(local_3f8.m_name._M_dataplus._M_p,
                    (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    CONCAT17(local_928.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_928.m_name.field_2._M_local_buf[6],
                                      local_928.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_name._M_dataplus._M_p != &local_598.m_name.field_2) {
    operator_delete(local_598.m_name._M_dataplus._M_p,
                    CONCAT53(local_598.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_598.m_name.field_2._M_local_buf[2],
                                      local_598.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_name._M_dataplus._M_p != &local_6f8.m_name.field_2) {
    operator_delete(local_6f8.m_name._M_dataplus._M_p,
                    local_6f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    local_690.m_name.field_2._M_allocated_capacity + 1);
  }
  tcu::TestLog::endSection((TestLog *)local_948._M_dataplus._M_p);
  local_a50._0_8_ = &aStack_a40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_a50,"Results","");
  local_ac0._0_8_ = &local_ab0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_ac0,"Results","");
  tcu::ScopedLogSection::ScopedLogSection
            (&local_370,(TestLog *)&log_00->_M_allocated_capacity,(string *)local_a50,
             (string *)local_ac0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar17 = (float)((pRVar3[-1].renderDataSize + pRVar9->renderDataSize) / 2);
  local_5c4 = local_854.coefficient * fVar17;
  local_5c0 = local_854.offset + local_5c4;
  endNdx = ((int)((ulong)((long)pRVar3 - (long)pRVar9) >> 3) * -0x49249249) / 2;
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a50,samples,0,endNdx,1,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_ac0,samples,endNdx,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,1,
             0x20);
  pRVar9 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pRVar3 = (samples->
           super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  fVar16 = (float)pRVar9->renderDataSize;
  local_59c = (float)pRVar3[-1].renderDataSize;
  local_9e8._0_4_ = fVar16;
  local_5a8 = (float)local_a50._0_4_;
  local_48 = ZEXT416((uint)local_a50._12_4_);
  local_5a4 = (float)local_ac0._0_4_;
  local_58 = ZEXT416((uint)fStack_ab4);
  local_5a0 = getAreaBetweenLines(fVar16,local_59c,(float)local_a50._0_4_,(float)local_a50._12_4_,
                                  (float)local_ac0._0_4_,fStack_ab4);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_a50,samples,0,
             (int)((ulong)((long)pRVar3 - (long)pRVar9) >> 3) * -0x49249249,2,0x20);
  fitLineToSamples<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>
            ((LineParametersWithConfidence *)local_ac0,samples,1,
             (int)((ulong)((long)(samples->
                                 super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                 )._M_impl.super__Vector_impl_data._M_finish -
                          (long)(samples->
                                super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                                )._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x49249249,2,
             0x20);
  local_5ac = (float)((samples->
                      super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                      )._M_impl.super__Vector_impl_data._M_start)->renderDataSize;
  local_5b0 = (float)(samples->
                     super__Vector_base<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>,_std::allocator<deqp::gles3::Performance::(anonymous_namespace)::RenderSampleResult<deqp::gles3::Performance::(anonymous_namespace)::RenderReadDuration>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish[-1].renderDataSize;
  local_5bc = (float)local_a50._0_4_;
  local_68 = ZEXT416((uint)local_a50._12_4_);
  local_5b8 = (float)local_ac0._0_4_;
  local_78 = ZEXT416((uint)fStack_ab4);
  local_5b4 = getAreaBetweenLines(local_5ac,local_5b0,(float)local_a50._0_4_,(float)local_a50._12_4_
                                  ,(float)local_ac0._0_4_,fStack_ab4);
  local_968._0_8_ = &local_958;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_968,"ResultLinearity","");
  paVar1 = local_a58;
  local_948._M_dataplus._M_p = (pointer)&local_948.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_948,"Sample linearity","");
  local_5e8._M_dataplus._M_p = (pointer)&local_5e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e8,"%","");
  fVar16 = (float)local_48._0_4_ * (float)local_9e8._0_4_ + local_5a8;
  fVar18 = (float)local_58._0_4_ * (float)local_9e8._0_4_ + local_5a4;
  uVar11 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_48._0_4_ * local_59c + local_5a8;
  fVar20 = (float)local_58._0_4_ * local_59c + local_5a4;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar11 & (uint)fVar18 | (uint)fVar16 & uVar11)) *
           (local_59c - (float)local_9e8._0_4_);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_5a0 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_a50,(string *)local_968,&local_948,&local_5e8,
             QP_KEY_TAG_QUALITY,(float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,(char *)local_a50._0_8_,
             local_a30._M_dataplus._M_p,local_a10._M_dataplus._M_p,local_9f0,local_9ec);
  local_608._M_dataplus._M_p = (pointer)&local_608.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_608,"SampleTemporalStability","")
  ;
  local_628._M_dataplus._M_p = (pointer)&local_628.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_628,"Sample temporal stability","");
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_718,"%","");
  fVar16 = (float)local_68._0_4_ * local_5ac + local_5bc;
  fVar18 = (float)local_78._0_4_ * local_5ac + local_5b8;
  uVar11 = -(uint)(fVar16 <= fVar18);
  fVar19 = (float)local_68._0_4_ * local_5b0 + local_5bc;
  fVar20 = (float)local_78._0_4_ * local_5b0 + local_5b8;
  uVar15 = -(uint)(fVar20 <= fVar19);
  fVar16 = ((float)(~uVar15 & (uint)fVar20 | (uint)fVar19 & uVar15) -
           (float)(~uVar11 & (uint)fVar18 | (uint)fVar16 & uVar11)) * (local_5b0 - local_5ac);
  fVar18 = (float)(~-(uint)(fVar16 < 1e-06) & (uint)(1.0 - local_5b4 / fVar16));
  fVar16 = 1.0;
  if (fVar18 <= 1.0) {
    fVar16 = fVar18;
  }
  tcu::LogNumber<float>::LogNumber
            ((LogNumber<float> *)local_ac0,&local_608,&local_628,&local_718,QP_KEY_TAG_QUALITY,
             (float)(~-(uint)(fVar18 < 0.0) & (uint)(fVar16 * 100.0)));
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,(char *)local_ac0._0_8_,
             local_aa0._M_dataplus._M_p,local_a80._M_dataplus._M_p,local_a60,local_a5c);
  local_738._M_dataplus._M_p = (pointer)&local_738.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_738,"ApproximatedConstantCost","");
  local_758._M_dataplus._M_p = (pointer)&local_758.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_758,"Approximated contant cost","");
  local_778._M_dataplus._M_p = (pointer)&local_778.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_778,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_9d0,&local_738,&local_758,&local_778,QP_KEY_TAG_TIME,local_854.offset);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_9d0.m_name._M_dataplus._M_p,
             local_9d0.m_desc._M_dataplus._M_p,local_9d0.m_unit._M_dataplus._M_p,local_9d0.m_tag,
             local_9d0.m_value);
  local_798._M_dataplus._M_p = (pointer)&local_798.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_798,"ApproximatedConstantCostConfidence60Lower","");
  local_7b8._M_dataplus._M_p = (pointer)&local_7b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7b8,"Approximated contant cost 60% confidence lower limit","");
  local_7d8._M_dataplus._M_p = (pointer)&local_7d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_7d8,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_690,&local_798,&local_7b8,&local_7d8,QP_KEY_TAG_TIME,
             local_854.offsetConfidenceLower);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_690.m_name._M_dataplus._M_p,
             local_690.m_desc._M_dataplus._M_p,local_690.m_unit._M_dataplus._M_p,local_690.m_tag,
             local_690.m_value);
  local_7f8._M_dataplus._M_p = (pointer)&local_7f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_7f8,"ApproximatedConstantCostConfidence60Upper","");
  local_818._M_dataplus._M_p = (pointer)&local_818.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_818,"Approximated contant cost 60% confidence upper limit","");
  local_838._M_dataplus._M_p = (pointer)&local_838.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_6f8,&local_7f8,&local_818,&local_838,QP_KEY_TAG_TIME,
             local_854.offsetConfidenceUpper);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_6f8.m_name._M_dataplus._M_p,
             local_6f8.m_desc._M_dataplus._M_p,local_6f8.m_unit._M_dataplus._M_p,local_6f8.m_tag,
             local_6f8.m_value);
  local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"ApproximatedLinearCost","");
  local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_1c8,"Approximated linear cost","");
  local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_598,&local_390,&local_1c8,&local_1e8,QP_KEY_TAG_TIME,
             local_854.coefficient * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_598.m_name._M_dataplus._M_p,
             local_598.m_desc._M_dataplus._M_p,local_598.m_unit._M_dataplus._M_p,local_598.m_tag,
             local_598.m_value);
  local_208._M_dataplus._M_p = (pointer)&local_208.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_208,"ApproximatedLinearCostConfidence60Lower","");
  local_228._M_dataplus._M_p = (pointer)&local_228.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,"Approximated linear cost 60% confidence lower limit","");
  local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_248,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_928,&local_208,&local_228,&local_248,QP_KEY_TAG_TIME,
             local_854.coefficientConfidenceLower * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_928.m_name._M_dataplus._M_p,
             local_928.m_desc._M_dataplus._M_p,local_928.m_unit._M_dataplus._M_p,local_928.m_tag,
             local_928.m_value);
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_268,"ApproximatedLinearCostConfidence60Upper","");
  local_288._M_dataplus._M_p = (pointer)&local_288.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,"Approximated linear cost 60% confidence upper limit","");
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"us / MB","");
  tcu::LogNumber<float>::LogNumber
            (&local_3f8,&local_268,&local_288,&local_2a8,QP_KEY_TAG_TIME,
             local_854.coefficientConfidenceUpper * 1024.0 * 1024.0);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_3f8.m_name._M_dataplus._M_p,
             local_3f8.m_desc._M_dataplus._M_p,local_3f8.m_unit._M_dataplus._M_p,local_3f8.m_tag,
             local_3f8.m_value);
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"ApproximatedProcessRate","")
  ;
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2e8,"Approximated processing rate","");
  local_308._M_dataplus._M_p = (pointer)&local_308.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_308,"MB / s","");
  fVar16 = fVar17 / ((local_5c0 / 1000.0) / 1000.0);
  local_9e8 = ZEXT416((uint)fVar16);
  tcu::LogNumber<float>::LogNumber
            (&local_460,&local_2c8,&local_2e8,&local_308,QP_KEY_TAG_PERFORMANCE,
             fVar16 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_460.m_name._M_dataplus._M_p,
             local_460.m_desc._M_dataplus._M_p,local_460.m_unit._M_dataplus._M_p,local_460.m_tag,
             local_460.m_value);
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,"ApproximatedProcessRateNoConstant","");
  local_328._M_dataplus._M_p = (pointer)&local_328.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_328,"Approximated processing rate without constant cost","");
  local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_348,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_8c0,&local_108,&local_328,&local_348,QP_KEY_TAG_PERFORMANCE,
             (fVar17 / ((local_5c4 / 1000.0) / 1000.0)) * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&paVar1->_M_allocated_capacity,local_8c0.m_name._M_dataplus._M_p,
             local_8c0.m_desc._M_dataplus._M_p,local_8c0.m_unit._M_dataplus._M_p,local_8c0.m_tag,
             local_8c0.m_value);
  local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_128,"SampleMedianTime","");
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Median sample time","");
  local_368._M_dataplus._M_p = (pointer)&local_368.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"us","");
  tcu::LogNumber<float>::LogNumber
            (&local_530,&local_128,&local_148,&local_368,QP_KEY_TAG_TIME,local_b4);
  tcu::TestLog::writeFloat
            ((TestLog *)&local_a58->_M_allocated_capacity,local_530.m_name._M_dataplus._M_p,
             local_530.m_desc._M_dataplus._M_p,local_530.m_unit._M_dataplus._M_p,local_530.m_tag,
             local_530.m_value);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_168,"SampleMedianProcess","");
  local_188._M_dataplus._M_p = (pointer)&local_188.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_188,"Median processing rate","");
  local_1a8._M_dataplus._M_p = (pointer)&local_1a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a8,"MB / s","");
  tcu::LogNumber<float>::LogNumber
            (&local_4c8,&local_168,&local_188,&local_1a8,QP_KEY_TAG_PERFORMANCE,
             local_94 * 0.0009765625 * 0.0009765625);
  tcu::TestLog::writeFloat
            ((TestLog *)&local_a58->_M_allocated_capacity,local_4c8.m_name._M_dataplus._M_p,
             local_4c8.m_desc._M_dataplus._M_p,local_4c8.m_unit._M_dataplus._M_p,local_4c8.m_tag,
             local_4c8.m_value);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_unit._M_dataplus._M_p != &local_4c8.m_unit.field_2) {
    operator_delete(local_4c8.m_unit._M_dataplus._M_p,
                    local_4c8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_desc._M_dataplus._M_p != &local_4c8.m_desc.field_2) {
    operator_delete(local_4c8.m_desc._M_dataplus._M_p,
                    local_4c8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8.m_name._M_dataplus._M_p != &local_4c8.m_name.field_2) {
    operator_delete(local_4c8.m_name._M_dataplus._M_p,
                    CONCAT26(local_4c8.m_name.field_2._M_allocated_capacity._6_2_,
                             CONCAT24(local_4c8.m_name.field_2._M_allocated_capacity._4_2_,
                                      CONCAT13(local_4c8.m_name.field_2._M_local_buf[3],
                                               CONCAT12(local_4c8.m_name.field_2._M_local_buf[2],
                                                        local_4c8.m_name.field_2.
                                                        _M_allocated_capacity._0_2_)))) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_188._M_dataplus._M_p != &local_188.field_2) {
    operator_delete(local_188._M_dataplus._M_p,local_188.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_168._M_dataplus._M_p != &local_168.field_2) {
    operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_unit._M_dataplus._M_p != &local_530.m_unit.field_2) {
    operator_delete(local_530.m_unit._M_dataplus._M_p,
                    local_530.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_desc._M_dataplus._M_p != &local_530.m_desc.field_2) {
    operator_delete(local_530.m_desc._M_dataplus._M_p,
                    local_530.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_530.m_name._M_dataplus._M_p != &local_530.m_name.field_2) {
    operator_delete(local_530.m_name._M_dataplus._M_p,
                    CONCAT26(local_530.m_name.field_2._M_allocated_capacity._6_2_,
                             local_530.m_name.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != &local_368.field_2) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_148._M_dataplus._M_p != &local_148.field_2) {
    operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_128._M_dataplus._M_p != &local_128.field_2) {
    operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_unit._M_dataplus._M_p != &local_8c0.m_unit.field_2) {
    operator_delete(local_8c0.m_unit._M_dataplus._M_p,
                    local_8c0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_desc._M_dataplus._M_p != &local_8c0.m_desc.field_2) {
    operator_delete(local_8c0.m_desc._M_dataplus._M_p,
                    local_8c0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_8c0.m_name._M_dataplus._M_p != &local_8c0.m_name.field_2) {
    operator_delete(local_8c0.m_name._M_dataplus._M_p,
                    CONCAT17(local_8c0.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_8c0.m_name.field_2._M_local_buf[6],
                                      local_8c0.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._M_dataplus._M_p != &local_348.field_2) {
    operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_328._M_dataplus._M_p != &local_328.field_2) {
    operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_unit._M_dataplus._M_p != &local_460.m_unit.field_2) {
    operator_delete(local_460.m_unit._M_dataplus._M_p,
                    local_460.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_desc._M_dataplus._M_p != &local_460.m_desc.field_2) {
    operator_delete(local_460.m_desc._M_dataplus._M_p,
                    local_460.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.m_name._M_dataplus._M_p != &local_460.m_name.field_2) {
    operator_delete(local_460.m_name._M_dataplus._M_p,
                    CONCAT44(local_460.m_name.field_2._M_allocated_capacity._4_4_,
                             local_460.m_name.field_2._M_allocated_capacity._0_4_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_308._M_dataplus._M_p != &local_308.field_2) {
    operator_delete(local_308._M_dataplus._M_p,local_308.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_unit._M_dataplus._M_p != &local_3f8.m_unit.field_2) {
    operator_delete(local_3f8.m_unit._M_dataplus._M_p,
                    local_3f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_desc._M_dataplus._M_p != &local_3f8.m_desc.field_2) {
    operator_delete(local_3f8.m_desc._M_dataplus._M_p,
                    local_3f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8.m_name._M_dataplus._M_p != &local_3f8.m_name.field_2) {
    operator_delete(local_3f8.m_name._M_dataplus._M_p,
                    (ulong)(local_3f8.m_name.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,local_268.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_unit._M_dataplus._M_p != &local_928.m_unit.field_2) {
    operator_delete(local_928.m_unit._M_dataplus._M_p,
                    local_928.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_desc._M_dataplus._M_p != &local_928.m_desc.field_2) {
    operator_delete(local_928.m_desc._M_dataplus._M_p,
                    local_928.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_928.m_name._M_dataplus._M_p != &local_928.m_name.field_2) {
    operator_delete(local_928.m_name._M_dataplus._M_p,
                    CONCAT17(local_928.m_name.field_2._M_local_buf[7],
                             CONCAT16(local_928.m_name.field_2._M_local_buf[6],
                                      local_928.m_name.field_2._M_allocated_capacity._0_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_248._M_dataplus._M_p != &local_248.field_2) {
    operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_228._M_dataplus._M_p != &local_228.field_2) {
    operator_delete(local_228._M_dataplus._M_p,local_228.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_208._M_dataplus._M_p != &local_208.field_2) {
    operator_delete(local_208._M_dataplus._M_p,local_208.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_unit._M_dataplus._M_p != &local_598.m_unit.field_2) {
    operator_delete(local_598.m_unit._M_dataplus._M_p,
                    local_598.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_desc._M_dataplus._M_p != &local_598.m_desc.field_2) {
    operator_delete(local_598.m_desc._M_dataplus._M_p,
                    local_598.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_598.m_name._M_dataplus._M_p != &local_598.m_name.field_2) {
    operator_delete(local_598.m_name._M_dataplus._M_p,
                    CONCAT53(local_598.m_name.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_598.m_name.field_2._M_local_buf[2],
                                      local_598.m_name.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_390._M_dataplus._M_p != &local_390.field_2) {
    operator_delete(local_390._M_dataplus._M_p,local_390.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_unit._M_dataplus._M_p != &local_6f8.m_unit.field_2) {
    operator_delete(local_6f8.m_unit._M_dataplus._M_p,
                    local_6f8.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_desc._M_dataplus._M_p != &local_6f8.m_desc.field_2) {
    operator_delete(local_6f8.m_desc._M_dataplus._M_p,
                    local_6f8.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_6f8.m_name._M_dataplus._M_p != &local_6f8.m_name.field_2) {
    operator_delete(local_6f8.m_name._M_dataplus._M_p,
                    local_6f8.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_dataplus._M_p != &local_838.field_2) {
    operator_delete(local_838._M_dataplus._M_p,
                    CONCAT53(local_838.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_838.field_2._M_local_buf[2],
                                      local_838.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_818._M_dataplus._M_p != &local_818.field_2) {
    operator_delete(local_818._M_dataplus._M_p,local_818.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7f8._M_dataplus._M_p != &local_7f8.field_2) {
    operator_delete(local_7f8._M_dataplus._M_p,
                    CONCAT17(local_7f8.field_2._M_local_buf[7],
                             local_7f8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_unit._M_dataplus._M_p != &local_690.m_unit.field_2) {
    operator_delete(local_690.m_unit._M_dataplus._M_p,
                    local_690.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_desc._M_dataplus._M_p != &local_690.m_desc.field_2) {
    operator_delete(local_690.m_desc._M_dataplus._M_p,
                    local_690.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_690.m_name._M_dataplus._M_p != &local_690.m_name.field_2) {
    operator_delete(local_690.m_name._M_dataplus._M_p,
                    local_690.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7d8._M_dataplus._M_p != &local_7d8.field_2) {
    operator_delete(local_7d8._M_dataplus._M_p,
                    CONCAT53(local_7d8.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_7d8.field_2._M_local_buf[2],
                                      local_7d8.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_7b8._M_dataplus._M_p != &local_7b8.field_2) {
    operator_delete(local_7b8._M_dataplus._M_p,
                    CONCAT17(local_7b8.field_2._M_local_buf[7],
                             local_7b8.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_798._M_dataplus._M_p != &local_798.field_2) {
    operator_delete(local_798._M_dataplus._M_p,local_798.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_unit._M_dataplus._M_p != &local_9d0.m_unit.field_2) {
    operator_delete(local_9d0.m_unit._M_dataplus._M_p,
                    local_9d0.m_unit.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_desc._M_dataplus._M_p != &local_9d0.m_desc.field_2) {
    operator_delete(local_9d0.m_desc._M_dataplus._M_p,
                    local_9d0.m_desc.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_9d0.m_name._M_dataplus._M_p != &local_9d0.m_name.field_2) {
    operator_delete(local_9d0.m_name._M_dataplus._M_p,
                    local_9d0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_778._M_dataplus._M_p != &local_778.field_2) {
    operator_delete(local_778._M_dataplus._M_p,
                    CONCAT53(local_778.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_778.field_2._M_local_buf[2],
                                      local_778.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_758._M_dataplus._M_p != &local_758.field_2) {
    operator_delete(local_758._M_dataplus._M_p,
                    CONCAT26(local_758.field_2._M_allocated_capacity._6_2_,
                             local_758.field_2._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_738._M_dataplus._M_p != &local_738.field_2) {
    operator_delete(local_738._M_dataplus._M_p,local_738.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a80._M_dataplus._M_p != &local_a80.field_2) {
    operator_delete(local_a80._M_dataplus._M_p,local_a80.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_aa0._M_dataplus._M_p != &local_aa0.field_2) {
    operator_delete(local_aa0._M_dataplus._M_p,local_aa0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_ac0._0_8_ != &local_ab0) {
    operator_delete((void *)local_ac0._0_8_,local_ab0._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,
                    CONCAT53(local_718.field_2._M_allocated_capacity._3_5_,
                             CONCAT12(local_718.field_2._M_local_buf[2],
                                      local_718.field_2._M_allocated_capacity._0_2_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_628._M_dataplus._M_p != &local_628.field_2) {
    operator_delete(local_628._M_dataplus._M_p,local_628.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_608._M_dataplus._M_p != &local_608.field_2) {
    operator_delete(local_608._M_dataplus._M_p,local_608.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a10._M_dataplus._M_p != &local_a10.field_2) {
    operator_delete(local_a10._M_dataplus._M_p,local_a10.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a30._M_dataplus._M_p != &local_a30.field_2) {
    operator_delete(local_a30._M_dataplus._M_p,local_a30.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a50._0_8_ != &aStack_a40) {
    operator_delete((void *)local_a50._0_8_,aStack_a40._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
    operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_948._M_dataplus._M_p != &local_948.field_2) {
    operator_delete(local_948._M_dataplus._M_p,(ulong)(local_948.field_2._M_allocated_capacity + 1))
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_968._0_8_ != &local_958) {
    operator_delete((void *)local_968._0_8_,
                    CONCAT17(local_958._M_local_buf[7],local_958._M_allocated_capacity._0_7_) + 1);
  }
  tcu::TestLog::endSection(local_370.m_log);
  RVar21.renderRateAtRange = (float)local_9e8._0_4_;
  RVar21.renderRateMedian = local_94;
  RVar21.renderRateAtInfinity = local_94;
  return RVar21;
}

Assistant:

static RenderSampleAnalyzeResult analyzeSampleResults (tcu::TestLog& log, const std::vector<RenderSampleResult<SampleType> >& samples)
{
	// Assume data is linear with some outliers, fit a line
	const LineParametersWithConfidence						theilSenFitting						= fitLineToSamples(samples);
	const typename SampleTypeTraits<SampleType>::StatsType	resultStats							= calculateSampleStatistics(theilSenFitting, samples);
	float													approximatedProcessingRate;
	float													approximatedProcessingRateNoConstant;

	// output raw samples
	{
		const tcu::ScopedLogSection	section(log, "Samples", "Samples");
		logSampleList(log, theilSenFitting, samples);
	}

	// Contributions
	if (SampleTypeTraits<SampleType>::LOG_CONTRIBUTIONS)
	{
		const tcu::ScopedLogSection	section(log, "Contribution", "Contributions");

		logFirstRenderContribution(log, samples, resultStats);
		logUploadContribution(log, samples, resultStats);
		logRenderContribution(log, samples, resultStats);
		logSecondRenderContribution(log, samples, resultStats);
		logReadContribution(log, samples, resultStats);
		logTotalContribution(log, samples, resultStats);
	}

	// print results
	{
		const tcu::ScopedLogSection	section(log, "Results", "Results");

		const int	medianDataSize						= (samples.front().renderDataSize + samples.back().renderDataSize) / 2;
		const float	approximatedRenderTime				= (theilSenFitting.offset + theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	approximatedRenderTimeNoConstant	= (theilSenFitting.coefficient * (float)medianDataSize) / 1000.0f / 1000.0f;
		const float	sampleLinearity						= calculateSampleFitLinearity(samples);
		const float	sampleTemporalStability				= calculateSampleTemporalStability(samples);

		approximatedProcessingRateNoConstant			= (float)medianDataSize / approximatedRenderTimeNoConstant;
		approximatedProcessingRate						= (float)medianDataSize / approximatedRenderTime;

		log	<< tcu::TestLog::Float("ResultLinearity", "Sample linearity", "%", QP_KEY_TAG_QUALITY, sampleLinearity * 100.0f)
			<< tcu::TestLog::Float("SampleTemporalStability", "Sample temporal stability", "%", QP_KEY_TAG_QUALITY, sampleTemporalStability * 100.0f)
			<< tcu::TestLog::Float("ApproximatedConstantCost", "Approximated contant cost", "us", QP_KEY_TAG_TIME, theilSenFitting.offset)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Lower", "Approximated contant cost 60% confidence lower limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceLower)
			<< tcu::TestLog::Float("ApproximatedConstantCostConfidence60Upper", "Approximated contant cost 60% confidence upper limit", "us", QP_KEY_TAG_TIME, theilSenFitting.offsetConfidenceUpper)
			<< tcu::TestLog::Float("ApproximatedLinearCost", "Approximated linear cost", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficient * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Lower", "Approximated linear cost 60% confidence lower limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceLower * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedLinearCostConfidence60Upper", "Approximated linear cost 60% confidence upper limit", "us / MB", QP_KEY_TAG_TIME, theilSenFitting.coefficientConfidenceUpper * 1024.0f * 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRate", "Approximated processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRate / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("ApproximatedProcessRateNoConstant", "Approximated processing rate without constant cost", "MB / s", QP_KEY_TAG_PERFORMANCE, approximatedProcessingRateNoConstant / 1024.0f / 1024.0f)
			<< tcu::TestLog::Float("SampleMedianTime", "Median sample time", "us", QP_KEY_TAG_TIME, resultStats.result.medianTime)
			<< tcu::TestLog::Float("SampleMedianProcess", "Median processing rate", "MB / s", QP_KEY_TAG_PERFORMANCE, resultStats.medianRate / 1024.0f / 1024.0f);
	}

	// return approximated render rate
	{
		RenderSampleAnalyzeResult result;

		result.renderRateMedian		= resultStats.medianRate;
		result.renderRateAtRange	= approximatedProcessingRate;
		result.renderRateAtInfinity = approximatedProcessingRateNoConstant;

		return result;
	}
	return RenderSampleAnalyzeResult();
}